

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall mjs::parser::parse_postfix_expression(parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  wostream *pwVar4;
  socklen_t *in_RCX;
  wchar_t *extraout_RDX;
  wstring_view *s;
  pointer *__ptr;
  token_type *in_RSI;
  wchar_t *in_R9;
  bool bVar5;
  wstring_view name;
  wstring_view message;
  expression_ptr lhs;
  token_type t;
  wostringstream _oss;
  undefined1 local_208 [16];
  wstring local_1f8;
  pointer local_1d8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [40];
  parser local_198 [2];
  
  parse_left_hand_side_expression((parser *)local_208);
  if ((char)in_RSI[0x1e] != line_terminator) {
    local_208._12_4_ = in_RSI[0x20];
    accept((parser *)(local_1c0 + 0x28),(int)in_RSI,(sockaddr *)0x11,in_RCX);
    bVar5 = true;
    if ((version)local_198[0].source_.
                 super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 0x72) {
      accept((parser *)local_1c0,(int)in_RSI,(sockaddr *)0x12,in_RCX);
      bVar5 = local_1c0._0_4_ != 0x72;
      token::destroy((token *)local_1c0);
    }
    token::destroy((token *)(local_1c0 + 0x28));
    uVar1 = local_208._0_8_;
    if (bVar5) {
      if ((((char)in_RSI[0x18] == line_terminator) &&
          (iVar3 = (**(code **)(*(long *)local_208._0_8_ + 0x18))(local_208._0_8_), iVar3 == 0)) &&
         (name._M_str = extraout_RDX,
         name._M_len = *(size_t *)((long)&((wstring *)(uVar1 + 8))->field_2 + 8),
         bVar2 = is_strict_mode_unassignable_identifier
                           ((mjs *)(((wstring *)(uVar1 + 0x28))->_M_dataplus)._M_p,name), bVar2)) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)(local_1c0 + 0x28));
        pwVar4 = std::operator<<((wostream *)(local_1c0 + 0x28),"\"");
        local_1d0._0_8_ = *(undefined8 *)((long)&((wstring *)(local_208._0_8_ + 8))->field_2 + 8);
        local_1d8 = (((wstring *)(local_208._0_8_ + 0x28))->_M_dataplus)._M_p;
        cpp_quote_abi_cxx11_(&local_1f8,(mjs *)&local_1d8,s);
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar4,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        std::operator<<(pwVar4,"\" may not be modified in strict mode");
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        local_1d8 = *(pointer *)in_RSI;
        local_1d0._0_8_ = *(undefined8 *)(in_RSI + 2);
        if (local_1d0._0_8_ != whitespace) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_1d0._0_8_ + rshiftequal) = *(int *)(local_1d0._0_8_ + rshiftequal) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_1d0._0_8_ + rshiftequal) = *(int *)(local_1d0._0_8_ + rshiftequal) + 1;
          }
        }
        local_1d0._8_4_ = in_RSI[0x19];
        local_1d0._12_4_ = in_RSI[0xc];
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = (size_t)local_1f8._M_dataplus._M_p;
        syntax_error((parser *)"parse_postfix_expression",(char *)0x229,(int)&local_1d8,
                     (source_extend *)local_1f8._M_string_length,message);
      }
      make_expression<mjs::postfix_expression,mjs::token_type&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                (this,in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_208 + 0xc));
      if (bVar5) goto LAB_0017e7d6;
    }
  }
  (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
LAB_0017e7d6:
  if ((element_type *)local_208._0_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_208._0_8_ + 8))();
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_postfix_expression() {
        auto lhs = parse_left_hand_side_expression();
        // no line break before
        if (line_break_skipped_) {
            return lhs;
        }
        if (auto t = current_token_type(); accept(token_type::plusplus) || accept(token_type::minusminus)) {
            if (strict_mode_ && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be modified in strict mode");
            }
            return make_expression<postfix_expression>(t, std::move(lhs));
        }
        return lhs;
    }